

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::LayoutBindingBaseCase::buildLayout_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,int binding)

{
  ostringstream bindingStr;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::operator<<(local_198,binding);
  std::__cxx11::stringbuf::str();
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x19])
            (__return_storage_ptr__,this,asStack_1b8);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

virtual String buildLayout(int binding)
	{
		std::ostringstream bindingStr;
		bindingStr << binding;
		return buildLayout(bindingStr.str());
	}